

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O0

void __thiscall Assimp::ASEImporter::BuildUniqueRepresentation(ASEImporter *this,Mesh *mesh)

{
  pointer *this_00;
  uint uVar1;
  pointer paVar2;
  float fVar3;
  uint32_t uVar4;
  bool bVar5;
  size_type sVar6;
  reference pFVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  reference pvVar12;
  reference this_01;
  pointer *local_210;
  pointer *local_188;
  uint local_17c;
  uint local_178;
  uint c_1;
  uint c;
  uint n;
  __normal_iterator<Assimp::ASE::Face_*,_std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>_>
  local_168;
  iterator i_1;
  uint fi;
  uint iCurrent;
  uint i;
  undefined1 local_140 [4];
  uint iSize;
  vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_> mBoneVertices;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> mNormals;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> mVertexColors;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> amTexCoords [8];
  undefined1 local_30 [8];
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> mPositions;
  Mesh *mesh_local;
  ASEImporter *this_local;
  
  mPositions.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)mesh;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_30);
  local_188 = &mVertexColors.
               super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  do {
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_188);
    local_188 = local_188 + 3;
  } while (local_188 !=
           (pointer *)
           &amTexCoords[7].
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage);
  std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::vector
            ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
             &mNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
             &mBoneVertices.
              super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>::vector
            ((vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_> *)local_140)
  ;
  sVar6 = std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>::size
                    ((vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_> *)
                     (mPositions.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 2));
  uVar1 = (int)sVar6 * 3;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_30,(ulong)uVar1
            );
  for (fi = 0; fi < 8; fi = fi + 1) {
    bVar5 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::empty
                      ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                       &mPositions.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage[(ulong)fi * 2 + 0x22].z);
    if (!bVar5) {
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                 &amTexCoords[(ulong)fi - 1].
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,(ulong)uVar1);
    }
  }
  bVar5 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::empty
                    ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
                     &mPositions.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage[0x32].z);
  if (!bVar5) {
    std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::resize
              ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
               &mNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)uVar1);
  }
  bVar5 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::empty
                    ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                     (mPositions.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  if (!bVar5) {
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
               &mBoneVertices.
                super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)uVar1);
  }
  bVar5 = std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>::empty
                    ((vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_> *)
                     &mPositions.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage[0x34].z);
  if (!bVar5) {
    std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>::resize
              ((vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_> *)
               local_140,(ulong)uVar1);
  }
  i_1._M_current._4_4_ = 0;
  i_1._M_current._0_4_ = 0;
  local_168._M_current =
       (Face *)std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>::begin
                         ((vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_> *)
                          (mPositions.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 2));
  while( true ) {
    _c = std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>::end
                   ((vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_> *)
                    (mPositions.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 2));
    bVar5 = __gnu_cxx::operator!=
                      (&local_168,
                       (__normal_iterator<Assimp::ASE::Face_*,_std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>_>
                        *)&c);
    if (!bVar5) break;
    for (c_1 = 0; paVar2 = mPositions.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage, c_1 < 3;
        c_1 = c_1 + 1) {
      pFVar7 = __gnu_cxx::
               __normal_iterator<Assimp::ASE::Face_*,_std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>_>
               ::operator*(&local_168);
      pvVar8 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                         ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)paVar2,
                          (ulong)(pFVar7->super_FaceWithSmoothingGroup).mIndices[c_1]);
      pvVar9 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                         ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_30
                          ,(ulong)i_1._M_current._4_4_);
      fVar3 = pvVar8->y;
      pvVar9->x = pvVar8->x;
      pvVar9->y = fVar3;
      pvVar9->z = pvVar8->z;
      local_178 = 0;
      while ((local_178 < 8 &&
             (bVar5 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::empty
                                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                                 &mPositions.
                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                  [(ulong)local_178 * 2 + 0x22].z), !bVar5))) {
        paVar2 = mPositions.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + (ulong)local_178 * 2 + 0x22;
        pFVar7 = __gnu_cxx::
                 __normal_iterator<Assimp::ASE::Face_*,_std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>_>
                 ::operator*(&local_168);
        pvVar8 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                           ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                            &paVar2->z,(ulong)pFVar7->amUVIndices[local_178][c_1]);
        pvVar9 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                           ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                            &amTexCoords[(ulong)local_178 - 1].
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (ulong)i_1._M_current._4_4_);
        fVar3 = pvVar8->y;
        pvVar9->x = pvVar8->x;
        pvVar9->y = fVar3;
        pvVar9->z = pvVar8->z;
        local_178 = local_178 + 1;
      }
      bVar5 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::empty
                        ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
                         &mPositions.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage[0x32].z);
      if (!bVar5) {
        paVar2 = mPositions.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 0x32;
        pFVar7 = __gnu_cxx::
                 __normal_iterator<Assimp::ASE::Face_*,_std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>_>
                 ::operator*(&local_168);
        pvVar10 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::operator[]
                            ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
                             &paVar2->z,(ulong)pFVar7->mColorIndices[c_1]);
        pvVar11 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::operator[]
                            ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
                             &mNormals.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (ulong)i_1._M_current._4_4_);
        fVar3 = pvVar10->g;
        pvVar11->r = pvVar10->r;
        pvVar11->g = fVar3;
        fVar3 = pvVar10->a;
        pvVar11->b = pvVar10->b;
        pvVar11->a = fVar3;
      }
      bVar5 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::empty
                        ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                         (mPositions.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      if (!bVar5) {
        pvVar8 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                           ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                            (mPositions.
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                            (ulong)((int)i_1._M_current * 3 + c_1));
        this_00 = &mBoneVertices.
                   super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pvVar9 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                           ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                            this_00,(ulong)i_1._M_current._4_4_);
        pvVar9->z = pvVar8->z;
        fVar3 = pvVar8->y;
        pvVar9->x = pvVar8->x;
        pvVar9->y = fVar3;
        pvVar8 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                           ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                            this_00,(ulong)i_1._M_current._4_4_);
        aiVector3t<float>::Normalize(pvVar8);
      }
      pFVar7 = __gnu_cxx::
               __normal_iterator<Assimp::ASE::Face_*,_std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>_>
               ::operator*(&local_168);
      uVar1 = (pFVar7->super_FaceWithSmoothingGroup).mIndices[c_1];
      sVar6 = std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>::size
                        ((vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                          *)&mPositions.
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage[0x34].z);
      if (uVar1 < sVar6) {
        paVar2 = mPositions.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 0x34;
        pFVar7 = __gnu_cxx::
                 __normal_iterator<Assimp::ASE::Face_*,_std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>_>
                 ::operator*(&local_168);
        pvVar12 = std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>::
                  operator[]((vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                              *)&paVar2->z,
                             (ulong)(pFVar7->super_FaceWithSmoothingGroup).mIndices[c_1]);
        this_01 = std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>::
                  operator[]((vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>
                              *)local_140,(ulong)i_1._M_current._4_4_);
        ASE::BoneVertex::operator=(this_01,pvVar12);
      }
      uVar4 = i_1._M_current._4_4_;
      pFVar7 = __gnu_cxx::
               __normal_iterator<Assimp::ASE::Face_*,_std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>_>
               ::operator*(&local_168);
      (pFVar7->super_FaceWithSmoothingGroup).mIndices[c_1] = uVar4;
      i_1._M_current._4_4_ = i_1._M_current._4_4_ + 1;
    }
    __gnu_cxx::
    __normal_iterator<Assimp::ASE::Face_*,_std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>_>
    ::operator++(&local_168);
    i_1._M_current._0_4_ = (int)i_1._M_current + 1;
  }
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator=
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
             (mPositions.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage + 4),
             (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
             &mBoneVertices.
              super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator=
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
             mPositions.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_30);
  std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::operator=
            ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
             &mPositions.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage[0x32].z,
             (vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
             &mNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  for (local_17c = 0; local_17c < 8; local_17c = local_17c + 1) {
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator=
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
               &mPositions.
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage[(ulong)local_17c * 2 + 0x22].z,
               (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
               &amTexCoords[(ulong)local_17c - 1].
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  std::vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>::~vector
            ((vector<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_> *)local_140)
  ;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
             &mBoneVertices.
              super__Vector_base<Assimp::ASE::BoneVertex,_std::allocator<Assimp::ASE::BoneVertex>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::~vector
            ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
             &mNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_210 = &amTexCoords[7].
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  do {
    local_210 = local_210 + -3;
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_210);
  } while ((pointer *)local_210 !=
           &mVertexColors.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_30);
  return;
}

Assistant:

void ASEImporter::BuildUniqueRepresentation(ASE::Mesh& mesh)    {
    // allocate output storage
    std::vector<aiVector3D> mPositions;
    std::vector<aiVector3D> amTexCoords[AI_MAX_NUMBER_OF_TEXTURECOORDS];
    std::vector<aiColor4D>  mVertexColors;
    std::vector<aiVector3D> mNormals;
    std::vector<BoneVertex> mBoneVertices;

    unsigned int iSize = (unsigned int)mesh.mFaces.size() * 3;
    mPositions.resize(iSize);

    // optional texture coordinates
    for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS;++i)    {
        if (!mesh.amTexCoords[i].empty())   {
            amTexCoords[i].resize(iSize);
        }
    }
    // optional vertex colors
    if (!mesh.mVertexColors.empty())    {
        mVertexColors.resize(iSize);
    }

    // optional vertex normals (vertex normals can simply be copied)
    if (!mesh.mNormals.empty()) {
        mNormals.resize(iSize);
    }
    // bone vertices. There is no need to change the bone list
    if (!mesh.mBoneVertices.empty())    {
        mBoneVertices.resize(iSize);
    }

    // iterate through all faces in the mesh
    unsigned int iCurrent = 0, fi = 0;
    for (std::vector<ASE::Face>::iterator i =  mesh.mFaces.begin();i != mesh.mFaces.end();++i,++fi) {
        for (unsigned int n = 0; n < 3;++n,++iCurrent)
        {
            mPositions[iCurrent] = mesh.mPositions[(*i).mIndices[n]];

            // add texture coordinates
            for (unsigned int c = 0; c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c)    {
                if (mesh.amTexCoords[c].empty())break;
                amTexCoords[c][iCurrent] = mesh.amTexCoords[c][(*i).amUVIndices[c][n]];
            }
            // add vertex colors
            if (!mesh.mVertexColors.empty())    {
                mVertexColors[iCurrent] = mesh.mVertexColors[(*i).mColorIndices[n]];
            }
            // add normal vectors
            if (!mesh.mNormals.empty()) {
                mNormals[iCurrent] = mesh.mNormals[fi*3+n];
                mNormals[iCurrent].Normalize();
            }

            // handle bone vertices
            if ((*i).mIndices[n] < mesh.mBoneVertices.size())   {
                // (sometimes this will cause bone verts to be duplicated
                //  however, I' quite sure Schrompf' JoinVerticesStep
                //  will fix that again ...)
                mBoneVertices[iCurrent] =  mesh.mBoneVertices[(*i).mIndices[n]];
            }
            (*i).mIndices[n] = iCurrent;
        }
    }

    // replace the old arrays
    mesh.mNormals = mNormals;
    mesh.mPositions = mPositions;
    mesh.mVertexColors = mVertexColors;

    for (unsigned int c = 0; c < AI_MAX_NUMBER_OF_TEXTURECOORDS;++c)
        mesh.amTexCoords[c] = amTexCoords[c];
}